

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O1

void ts_range_array_get_changed_ranges
               (TSRange *old_ranges,uint old_range_count,TSRange *new_ranges,uint new_range_count,
               TSRangeArray *differences)

{
  TSRange *pTVar1;
  bool bVar2;
  bool bVar3;
  uint32_t *puVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  ulong uVar7;
  uint32_t uVar9;
  TSRange *pTVar8;
  uint uVar10;
  long lVar11;
  uint32_t uVar12;
  ulong uVar13;
  uint32_t uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  Length start;
  Length start_00;
  Length start_01;
  Length end;
  Length end_00;
  Length end_01;
  
  if (old_range_count != 0 || new_range_count != 0) {
    bVar17 = new_range_count != 0;
    bVar18 = old_range_count != 0;
    uVar7 = 0;
    uVar10 = 0;
    uVar5 = 0;
    uVar16 = 0;
    bVar2 = false;
    bVar3 = false;
    do {
      pTVar1 = old_ranges + uVar10;
      if (bVar2) {
        puVar4 = &pTVar1->end_byte;
        lVar11 = 0xc;
        pTVar8 = (TSRange *)&pTVar1->end_point;
LAB_001270ec:
        uVar12 = *puVar4;
        uVar14 = *(uint32_t *)((long)&(pTVar1->start_point).row + lVar11);
        uVar15 = (ulong)(pTVar8->start_point).row << 0x20;
      }
      else {
        uVar14 = 0xffffffff;
        uVar12 = 0xffffffff;
        uVar15 = 0xffffffff00000000;
        if (bVar18) {
          puVar4 = &pTVar1->start_byte;
          lVar11 = 4;
          pTVar8 = pTVar1;
          goto LAB_001270ec;
        }
      }
      pTVar1 = new_ranges + uVar7;
      if (bVar3) {
        puVar4 = &pTVar1->end_byte;
        lVar11 = 0xc;
        pTVar8 = (TSRange *)&pTVar1->end_point;
LAB_0012714a:
        uVar9 = *puVar4;
        uVar6 = *(uint32_t *)((long)&(pTVar1->start_point).row + lVar11);
        uVar13 = (ulong)(pTVar8->start_point).row << 0x20;
      }
      else {
        uVar6 = 0xffffffff;
        uVar9 = 0xffffffff;
        uVar13 = 0xffffffff00000000;
        if (bVar17) {
          puVar4 = &pTVar1->start_byte;
          lVar11 = 4;
          pTVar8 = pTVar1;
          goto LAB_0012714a;
        }
      }
      bVar18 = (bool)(bVar2 ^ bVar3);
      if (uVar12 < uVar9) {
        if (bVar18) {
          end._0_8_ = uVar15 | uVar12;
          start.extent.column = uVar5;
          start.bytes = (int)uVar16;
          start.extent.row = (int)(uVar16 >> 0x20);
          end.extent.column = uVar14;
          ts_range_array_add(differences,start,end);
        }
        uVar10 = uVar10 + bVar2;
        uVar16 = uVar15 | uVar12;
        bVar2 = (bool)(bVar2 ^ 1);
        uVar5 = uVar14;
      }
      else {
        uVar15 = (ulong)uVar9;
        if (uVar9 < uVar12) {
          if (bVar18) {
            end_00._0_8_ = uVar13 | uVar15;
            start_00.extent.column = uVar5;
            start_00.bytes = (int)uVar16;
            start_00.extent.row = (int)(uVar16 >> 0x20);
            end_00.extent.column = uVar6;
            ts_range_array_add(differences,start_00,end_00);
          }
          uVar7 = (ulong)((int)uVar7 + (uint)bVar3);
          uVar16 = uVar13 | uVar15;
          bVar3 = (bool)(bVar3 ^ 1);
          uVar5 = uVar6;
        }
        else {
          if (bVar18) {
            end_01._0_8_ = uVar13 | uVar15;
            start_01.extent.column = uVar5;
            start_01.bytes = (int)uVar16;
            start_01.extent.row = (int)(uVar16 >> 0x20);
            end_01.extent.column = uVar6;
            ts_range_array_add(differences,start_01,end_01);
          }
          uVar10 = uVar10 + bVar2;
          uVar7 = (ulong)((int)uVar7 + (uint)bVar3);
          bVar2 = (bool)(bVar2 ^ 1);
          bVar3 = (bool)(bVar3 ^ 1);
          uVar16 = uVar13 | uVar15;
          uVar5 = uVar6;
        }
      }
      bVar17 = (uint)uVar7 < new_range_count;
      bVar18 = uVar10 < old_range_count;
    } while ((bVar18) || ((uint)uVar7 < new_range_count));
  }
  return;
}

Assistant:

void ts_range_array_get_changed_ranges(
  const TSRange *old_ranges, unsigned old_range_count,
  const TSRange *new_ranges, unsigned new_range_count,
  TSRangeArray *differences
) {
  unsigned new_index = 0;
  unsigned old_index = 0;
  Length current_position = length_zero();
  bool in_old_range = false;
  bool in_new_range = false;

  while (old_index < old_range_count || new_index < new_range_count) {
    const TSRange *old_range = &old_ranges[old_index];
    const TSRange *new_range = &new_ranges[new_index];

    Length next_old_position;
    if (in_old_range) {
      next_old_position = (Length) {old_range->end_byte, old_range->end_point};
    } else if (old_index < old_range_count) {
      next_old_position = (Length) {old_range->start_byte, old_range->start_point};
    } else {
      next_old_position = LENGTH_MAX;
    }

    Length next_new_position;
    if (in_new_range) {
      next_new_position = (Length) {new_range->end_byte, new_range->end_point};
    } else if (new_index < new_range_count) {
      next_new_position = (Length) {new_range->start_byte, new_range->start_point};
    } else {
      next_new_position = LENGTH_MAX;
    }

    if (next_old_position.bytes < next_new_position.bytes) {
      if (in_old_range != in_new_range) {
        ts_range_array_add(differences, current_position, next_old_position);
      }
      if (in_old_range) old_index++;
      current_position = next_old_position;
      in_old_range = !in_old_range;
    } else if (next_new_position.bytes < next_old_position.bytes) {
      if (in_old_range != in_new_range) {
        ts_range_array_add(differences, current_position, next_new_position);
      }
      if (in_new_range) new_index++;
      current_position = next_new_position;
      in_new_range = !in_new_range;
    } else {
      if (in_old_range != in_new_range) {
        ts_range_array_add(differences, current_position, next_new_position);
      }
      if (in_old_range) old_index++;
      if (in_new_range) new_index++;
      in_old_range = !in_old_range;
      in_new_range = !in_new_range;
      current_position = next_new_position;
    }
  }
}